

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O2

int secp256k1_jacobi32_maybe_var(secp256k1_modinv32_signed30 *x,secp256k1_modinv32_modinfo *modinfo)

{
  int iVar1;
  int iVar2;
  long lVar3;
  byte bVar4;
  int len;
  int i;
  int iVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  secp256k1_modinv32_trans2x2 t;
  secp256k1_modinv32_signed30 f;
  int32_t iStack_5c;
  secp256k1_modinv32_signed30 g;
  
  f.v[8] = (modinfo->modulus).v[8];
  f.v._0_8_ = *(undefined8 *)(modinfo->modulus).v;
  f.v._8_8_ = *(undefined8 *)((modinfo->modulus).v + 2);
  f.v._16_8_ = *(undefined8 *)((modinfo->modulus).v + 4);
  f.v._24_8_ = *(undefined8 *)((modinfo->modulus).v + 6);
  g.v[8] = x->v[8];
  g.v._0_8_ = *(undefined8 *)x->v;
  g.v._8_8_ = *(undefined8 *)(x->v + 2);
  g.v._16_8_ = *(undefined8 *)(x->v + 4);
  g.v._24_8_ = *(undefined8 *)(x->v + 6);
  uVar9 = 0;
  iVar7 = -1;
  iVar2 = 0;
  len = 9;
  do {
    if (iVar2 == 0x32) {
      return 0;
    }
    uVar10 = f.v[1] << 0x1e | f.v[0];
    uVar12 = g.v[1] << 0x1e | g.v[0];
    t.q = 0;
    t.u = 1;
    t.r = 1;
    iVar5 = 0x1e;
    t.v = 0;
    while( true ) {
      uVar8 = -1 << ((byte)iVar5 & 0x1f) | uVar12;
      uVar11 = 0;
      if (uVar8 != 0) {
        for (; (uVar8 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
        }
      }
      bVar4 = (byte)uVar11;
      uVar12 = uVar12 >> (bVar4 & 0x1f);
      t.u = t.u << (bVar4 & 0x1f);
      t.v = t.v << (bVar4 & 0x1f);
      iVar7 = iVar7 - uVar11;
      uVar8 = uVar10 >> 1;
      uVar9 = (uVar10 >> 2 ^ uVar8) & uVar11 ^ uVar9;
      iVar5 = iVar5 - uVar11;
      if (iVar5 == 0) break;
      uVar11 = uVar12;
      iVar14 = t.q;
      iVar13 = t.r;
      if (iVar7 < 0) {
        iVar7 = -iVar7;
        uVar9 = uVar9 ^ (uVar12 & uVar10) >> 1;
        uVar8 = uVar12 >> 1;
        uVar11 = uVar10;
        uVar10 = uVar12;
        iVar14 = t.u;
        iVar13 = t.v;
        t.u = t.q;
        t.v = t.r;
      }
      iVar1 = iVar7 + 1;
      if (iVar5 <= iVar7 + 1) {
        iVar1 = iVar5;
      }
      uVar8 = ((uint)(byte)(secp256k1_modinv32_inv256[uVar8 & 0x7f] * (char)uVar11) <<
              (-(char)iVar1 & 0x1fU)) >> (-(char)iVar1 & 0x1fU);
      uVar12 = uVar8 * uVar10 + uVar11;
      t.q = uVar8 * t.u + iVar14;
      t.r = uVar8 * t.v + iVar13;
    }
    secp256k1_modinv32_update_fg_30_var(len,&f,&g,&t);
    lVar3 = (long)len;
    if (f.v[0] == 1) {
      uVar10 = 0;
      for (lVar6 = 1; lVar6 < lVar3; lVar6 = lVar6 + 1) {
        uVar10 = uVar10 | f.v[lVar6];
      }
      if (uVar10 == 0) {
        return 1 - (uVar9 * 2 & 2);
      }
    }
    iVar5 = len + -1;
    if ((len + -2 < 0 || f.v[lVar3 + -1] != 0) || g.v[lVar3 + -1] != 0) {
      iVar5 = len;
    }
    iVar2 = iVar2 + 1;
    len = iVar5;
  } while( true );
}

Assistant:

static int secp256k1_jacobi32_maybe_var(const secp256k1_modinv32_signed30 *x, const secp256k1_modinv32_modinfo *modinfo) {
    /* Start with f=modulus, g=x, eta=-1. */
    secp256k1_modinv32_signed30 f = modinfo->modulus;
    secp256k1_modinv32_signed30 g = *x;
    int j, len = 9;
    int32_t eta = -1; /* eta = -delta; delta is initially 1 */
    int32_t cond, fn, gn;
    int jac = 0;
    int count;

    /* The input limbs must all be non-negative. */
    VERIFY_CHECK(g.v[0] >= 0 && g.v[1] >= 0 && g.v[2] >= 0 && g.v[3] >= 0 && g.v[4] >= 0 && g.v[5] >= 0 && g.v[6] >= 0 && g.v[7] >= 0 && g.v[8] >= 0);

    /* If x > 0, then if the loop below converges, it converges to f=g=gcd(x,modulus). Since we
     * require that gcd(x,modulus)=1 and modulus>=3, x cannot be 0. Thus, we must reach f=1 (or
     * time out). */
    VERIFY_CHECK((g.v[0] | g.v[1] | g.v[2] | g.v[3] | g.v[4] | g.v[5] | g.v[6] | g.v[7] | g.v[8]) != 0);

    for (count = 0; count < JACOBI32_ITERATIONS; ++count) {
        /* Compute transition matrix and new eta after 30 posdivsteps. */
        secp256k1_modinv32_trans2x2 t;
        eta = secp256k1_modinv32_posdivsteps_30_var(eta, f.v[0] | ((uint32_t)f.v[1] << 30), g.v[0] | ((uint32_t)g.v[1] << 30), &t, &jac);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */

        secp256k1_modinv32_update_fg_30_var(len, &f, &g, &t);
        /* If the bottom limb of f is 1, there is a chance that f=1. */
        if (f.v[0] == 1) {
            cond = 0;
            /* Check if the other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= f.v[j];
            }
            /* If so, we're done. If f=1, the Jacobi symbol (g | f)=1. */
            if (cond == 0) return 1 - 2*(jac & 1);
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int32_t)len - 2) >> 31;
        cond |= fn;
        cond |= gn;
        /* If so, reduce length. */
        if (cond == 0) --len;

        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */
    }

    /* The loop failed to converge to f=g after 1500 iterations. Return 0, indicating unknown result. */
    return 0;
}